

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *format;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/input.c"
                  ,0x1e8,"void glfwSetInputMode(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  uVar3 = (ulong)(uint)mode;
  switch(mode) {
  case 0x33001:
    if (value - 0x34004U < 0xfffffffd) {
      format = "Invalid cursor mode 0x%08X";
      uVar3 = (ulong)(uint)value;
      goto LAB_001183fd;
    }
    if (*(int *)(handle + 0x74) != value) {
      *(int *)(handle + 0x74) = value;
      _glfwPlatformGetCursorPos
                ((_GLFWwindow *)handle,(double *)(handle + 0x1e0),(double *)(handle + 0x1e8));
      iVar1 = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
      if (iVar1 != 0) {
        _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
        return;
      }
    }
    break;
  case 0x33002:
    if (*(uint *)(handle + 0x68) != (uint)(value != 0)) {
      if (value == 0) {
        lVar2 = 0x80;
        do {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x1dd);
      }
      *(uint *)(handle + 0x68) = (uint)(value != 0);
    }
    break;
  case 0x33003:
    if (*(uint *)(handle + 0x6c) != (uint)(value != 0)) {
      if (value == 0) {
        uVar3 = *(ulong *)(handle + 0x78);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar3;
        if ((char)uVar3 == '\x03') {
          handle[0x78] = (GLFWwindow)0x0;
        }
        auVar5[1] = -((char)uVar3 == '\0');
        auVar5[0] = 0xff;
        auVar5[2] = -((char)(uVar3 >> 8) == '\x03');
        auVar5[3] = -((char)(uVar3 >> 0x10) == '\x03');
        auVar5[4] = 0xff;
        cVar6 = (char)(uVar3 >> 0x20);
        auVar5[5] = -(cVar6 == '\0');
        auVar5[6] = -((char)(uVar3 >> 0x28) == '\0');
        auVar5[7] = -((char)(uVar3 >> 0x30) == '\0');
        auVar5[8] = 0xff;
        auVar5[9] = 0xff;
        auVar5[10] = 0xff;
        auVar5[0xb] = 0xff;
        auVar5[0xc] = 0xff;
        auVar5[0xd] = 0xff;
        auVar5[0xe] = 0xff;
        auVar5[0xf] = 0xff;
        if ((auVar5[2] & 1) != 0) {
          handle[0x79] = (GLFWwindow)0x0;
        }
        auVar4 = pshuflw(auVar5,auVar4,0x55);
        if (auVar4[4] == '\x03') {
          handle[0x7a] = (GLFWwindow)0x0;
        }
        if ((char)(uVar3 >> 0x18) == '\x03') {
          handle[0x7b] = (GLFWwindow)0x0;
        }
        if (cVar6 == '\0') {
          handle[0x7c] = (GLFWwindow)0x0;
        }
        handle[0x7d] = (GLFWwindow)0x0;
        handle[0x7e] = (GLFWwindow)0x0;
        handle[0x7f] = (GLFWwindow)0x0;
      }
      *(uint *)(handle + 0x6c) = (uint)(value != 0);
    }
    break;
  case 0x33004:
    *(uint *)(handle + 0x70) = (uint)(value != 0);
    break;
  default:
    format = "Invalid input mode 0x%08X";
LAB_001183fd:
    _glfwInputError(0x10003,format,uVar3);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (mode == GLFW_CURSOR)
    {
        if (value != GLFW_CURSOR_NORMAL &&
            value != GLFW_CURSOR_HIDDEN &&
            value != GLFW_CURSOR_DISABLED)
        {
            _glfwInputError(GLFW_INVALID_ENUM,
                            "Invalid cursor mode 0x%08X",
                            value);
            return;
        }

        if (window->cursorMode == value)
            return;

        window->cursorMode = value;

        _glfwPlatformGetCursorPos(window,
                                  &window->virtualCursorPosX,
                                  &window->virtualCursorPosY);

        if (_glfwPlatformWindowFocused(window))
            _glfwPlatformSetCursorMode(window, value);
    }
    else if (mode == GLFW_STICKY_KEYS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyKeys == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky keys
            for (i = 0;  i <= GLFW_KEY_LAST;  i++)
            {
                if (window->keys[i] == _GLFW_STICK)
                    window->keys[i] = GLFW_RELEASE;
            }
        }

        window->stickyKeys = value;
    }
    else if (mode == GLFW_STICKY_MOUSE_BUTTONS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyMouseButtons == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky mouse buttons
            for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
            {
                if (window->mouseButtons[i] == _GLFW_STICK)
                    window->mouseButtons[i] = GLFW_RELEASE;
            }
        }

        window->stickyMouseButtons = value;
    }
    else if (mode == GLFW_LOCK_KEY_MODS)
        window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}